

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O0

void __thiscall MC::MC_Driver::parse(MC_Driver *this,char *filename)

{
  byte bVar1;
  istream local_220 [8];
  ifstream in_file;
  char *filename_local;
  MC_Driver *this_local;
  
  if (filename == (char *)0x0) {
    __assert_fail("filename != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Cjkkkk[P]minisql/mc_driver.cpp"
                  ,0x22,"void MC::MC_Driver::parse(const char *const)");
  }
  std::ifstream::ifstream(local_220,filename,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    exit(1);
  }
  parse_helper(this,local_220);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void 
MC::MC_Driver::parse( const char * const filename )
{
   /**
    * Remember, if you want to have checks in release mode
    * then this needs to be an if statement 
    */
   assert( filename != nullptr );
   std::ifstream in_file( filename );
   if( ! in_file.good() )
   {
       exit( EXIT_FAILURE );
   }
   parse_helper( in_file );
   return;
}